

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O2

shared_ptr<LToken> __thiscall LLexer::from_string(LLexer *this,string *token)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  shared_ptr<LToken> sVar2;
  
  bVar1 = std::operator==(in_RDX,"break");
  if (((((!bVar1) && (bVar1 = std::operator==(in_RDX,"do"), !bVar1)) &&
       (bVar1 = std::operator==(in_RDX,"else"), !bVar1)) &&
      ((((bVar1 = std::operator==(in_RDX,"end"), !bVar1 &&
         (bVar1 = std::operator==(in_RDX,"for"), !bVar1)) &&
        ((bVar1 = std::operator==(in_RDX,"function"), !bVar1 &&
         ((bVar1 = std::operator==(in_RDX,"if"), !bVar1 &&
          (bVar1 = std::operator==(in_RDX,"in"), !bVar1)))))) &&
       (bVar1 = std::operator==(in_RDX,"return"), !bVar1)))) &&
     (((bVar1 = std::operator==(in_RDX,"then"), !bVar1 &&
       (bVar1 = std::operator==(in_RDX,"to"), !bVar1)) &&
      (bVar1 = std::operator==(in_RDX,"while"), !bVar1)))) {
    std::operator==(in_RDX,"yield");
  }
  sVar2 = std::make_shared<LToken,LNodeType,std::__cxx11::string>
                    ((LNodeType *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffec);
  sVar2.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LToken>)sVar2.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LToken> LLexer::from_string(std::string token) {
    if (token == "break")
        return std::make_shared<LToken>(LNodeType::BREAK, std::move(token));
    if (token == "do")
        return std::make_shared<LToken>(LNodeType::DO, std::move(token));
    if (token == "else")
        return std::make_shared<LToken>(LNodeType::ELSE, std::move(token));
    if (token == "end")
        return std::make_shared<LToken>(LNodeType::END, std::move(token));
    if (token == "for")
        return std::make_shared<LToken>(LNodeType::FOR, std::move(token));
    if (token == "function")
        return std::make_shared<LToken>(LNodeType::FUNCTION, std::move(token));
    if (token == "if")
        return std::make_shared<LToken>(LNodeType::IF, std::move(token));
    if (token == "in")
        return std::make_shared<LToken>(LNodeType::IN, std::move(token));
    if (token == "return")
        return std::make_shared<LToken>(LNodeType::RETURN, std::move(token));
    if (token == "then")
        return std::make_shared<LToken>(LNodeType::THEN, std::move(token));
    if (token == "to")
        return std::make_shared<LToken>(LNodeType::TO, std::move(token));
    if (token == "while")
        return std::make_shared<LToken>(LNodeType::WHILE, std::move(token));
    if (token == "yield")
        return std::make_shared<LToken>(LNodeType::YIELD, std::move(token));
    return std::make_shared<LToken>(LNodeType::VAR, std::move(token));
}